

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void PurgeWord2000Attributes(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  TidyAttrId TVar2;
  uint uVar3;
  AttVal *pAVar4;
  ctmbstr s1;
  AttVal *av;
  AttVal *pAVar5;
  bool bVar6;
  
  pAVar5 = node->attributes;
  av = (AttVal *)0x0;
LAB_00137c34:
  bVar6 = av == (AttVal *)0x0;
  pAVar4 = av;
  av = pAVar5;
  if (bVar6) {
    pAVar4 = (AttVal *)&node->attributes;
  }
  do {
    if (av == (AttVal *)0x0) {
      return;
    }
    pAVar5 = av->next;
    if (av->dict == (Attribute *)0x0) {
LAB_00137ce1:
      if (av->attribute == (ctmbstr)0x0) goto LAB_00137c34;
      iVar1 = prvTidytmbstrncmp(av->attribute,"x:",2);
      if (iVar1 != 0) goto LAB_00137c34;
    }
    else {
      TVar2 = av->dict->id;
      if (TVar2 == TidyAttr_CLASS) {
        if (av->value == (ctmbstr)0x0) {
          s1 = (ctmbstr)0x0;
        }
        else {
          iVar1 = prvTidytmbstrcasecmp(av->value,"Code");
          if (iVar1 == 0) goto LAB_00137c34;
          s1 = av->value;
        }
        iVar1 = prvTidytmbstrncmp(s1,"Mso",3);
        if (iVar1 != 0) goto LAB_00137c34;
        if (av->dict == (Attribute *)0x0) goto LAB_00137ce1;
        TVar2 = av->dict->id;
        if (TVar2 != TidyAttr_CLASS) goto LAB_00137caa;
      }
      else {
LAB_00137caa:
        if (TVar2 != TidyAttr_WIDTH) {
          if ((TVar2 == TidyAttr_LANG) || (TVar2 == TidyAttr_STYLE)) goto LAB_00137d05;
          if (TVar2 != TidyAttr_HEIGHT) goto LAB_00137ce1;
        }
        if (((node->tag == (Dict *)0x0) || (uVar3 = node->tag->id - TidyTag_TD, 6 < uVar3)) ||
           ((0x49U >> (uVar3 & 0x1f) & 1) == 0)) goto LAB_00137ce1;
      }
    }
LAB_00137d05:
    pAVar4->next = pAVar5;
    prvTidyFreeAttribute(doc,av);
    av = pAVar5;
  } while( true );
}

Assistant:

static void PurgeWord2000Attributes( TidyDocImpl* doc, Node* node )
{
    AttVal *attr, *next, *prev = NULL;

    for ( attr = node->attributes; attr; attr = next )
    {
        next = attr->next;

        /* special check for class="Code" denoting pre text */
        /* Pass thru user defined styles as HTML class names */
        if (attrIsCLASS(attr))
        {
            if (AttrValueIs(attr, "Code") ||
                 TY_(tmbstrncmp)(attr->value, "Mso", 3) != 0 )
            {
                prev = attr;
                continue;
            }
        }

        if (attrIsCLASS(attr) ||
            attrIsSTYLE(attr) ||
            attrIsLANG(attr)  ||
             ( (attrIsHEIGHT(attr) || attrIsWIDTH(attr)) &&
               (nodeIsTD(node) || nodeIsTR(node) || nodeIsTH(node)) ) ||
             (attr->attribute && TY_(tmbstrncmp)(attr->attribute, "x:", 2) == 0) )
        {
            if (prev)
                prev->next = next;
            else
                node->attributes = next;

            TY_(FreeAttribute)( doc, attr );
        }
        else
            prev = attr;
    }
}